

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_MemEncode
               (CLzmaEncHandle pp,Byte *dest,SizeT *destLen,Byte *src,SizeT srcLen,int writeEndMark,
               ICompressProgress *progress,ISzAlloc *alloc,ISzAlloc *allocBig)

{
  Byte *in_RCX;
  long *in_RDX;
  ISzAlloc *in_RSI;
  CLzmaEnc *in_RDI;
  SizeT in_R8;
  Bool in_R9D;
  CSeqOutStreamBuf outStream;
  CLzmaEnc *p;
  SRes res;
  ICompressProgress *progress_00;
  int iVar1;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  SRes local_4;
  
  LzmaEnc_SetInputBuf(in_RDI,in_RCX,in_R8);
  progress_00 = (ICompressProgress *)*in_RDX;
  iVar1 = 0;
  in_RDI->writeEndMark = in_R9D;
  local_4 = LzmaEnc_Encode((CLzmaEncHandle)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                           (ISeqOutStream *)in_RDI,
                           (ISeqInStream *)((ulong)in_stack_ffffffffffffffbc << 0x20),progress_00,
                           in_RSI,(ISzAlloc *)MyWrite);
  *in_RDX = *in_RDX - (long)progress_00;
  if (iVar1 != 0) {
    local_4 = 7;
  }
  return local_4;
}

Assistant:

SRes LzmaEnc_MemEncode(CLzmaEncHandle pp, Byte* dest, SizeT* destLen, const Byte* src, SizeT srcLen,
                       int writeEndMark, ICompressProgress* progress, ISzAlloc* alloc, ISzAlloc* allocBig) {
  SRes res;
  CLzmaEnc* p = (CLzmaEnc*)pp;

  CSeqOutStreamBuf outStream;

  LzmaEnc_SetInputBuf(p, src, srcLen);

  outStream.funcTable.Write = MyWrite;
  outStream.data = dest;
  outStream.rem = *destLen;
  outStream.overflow = False;

  p->writeEndMark = writeEndMark;
  res = LzmaEnc_Encode(pp, &outStream.funcTable, &p->seqBufInStream.funcTable,
                       progress, alloc, allocBig);

  *destLen -= outStream.rem;
  if (outStream.overflow)
    return SZ_ERROR_OUTPUT_EOF;
  return res;
}